

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O0

int ovf_write_segment_8(ovf_file *ovf_file_ptr,ovf_segment *segment,double *data,int format)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  int *args;
  int in_R9D;
  undefined1 local_60 [4];
  int retcode;
  int local_2c;
  ovf_segment *poStack_28;
  int format_local;
  double *data_local;
  ovf_segment *segment_local;
  ovf_file *ovf_file_ptr_local;
  
  args = (int *)CONCAT44(in_register_0000000c,format);
  if (ovf_file_ptr == (ovf_file *)0x0) {
    ovf_file_ptr_local._4_4_ = -2;
  }
  else {
    local_2c = format;
    poStack_28 = (ovf_segment *)data;
    data_local = (double *)segment;
    segment_local = (ovf_segment *)ovf_file_ptr;
    if (segment == (ovf_segment *)0x0) {
      std::__cxx11::string::operator=
                ((string *)&ovf_file_ptr->_state->message_latest,
                 "libovf ovf_write_segment_8: invalid segment pointer");
      ovf_file_ptr_local._4_4_ = -2;
    }
    else {
      bVar1 = check_segment(segment);
      if (bVar1) {
        if (poStack_28 == (ovf_segment *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)(segment_local->valueunits + 0x98),
                     "libovf ovf_write_segment_8: invalid data pointer");
          ovf_file_ptr_local._4_4_ = -2;
        }
        else {
          if ((local_2c == 2) || (local_2c == 1)) {
            local_2c = 0;
          }
          if (((local_2c == 0) || (local_2c == 3)) || (local_2c == 4)) {
            ovf_file_ptr_local._4_4_ =
                 ovf::detail::write::segment<double>
                           ((write *)segment_local,(ovf_file *)data_local,poStack_28,(double *)0x0,
                            SUB41(local_2c,0),in_R9D);
            if (ovf_file_ptr_local._4_4_ != -1) {
              std::__cxx11::string::operator+=
                        ((string *)(segment_local->valueunits + 0x98),
                         "\novf_write_segment_8 failed.");
            }
          }
          else {
            fmt::v5::format<char[51],int>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,(v5 *)"libovf ovf_write_segment_8: invalid format \'{}\'...",
                       (char (*) [51])&local_2c,args);
            std::__cxx11::string::operator=
                      ((string *)(segment_local->valueunits + 0x98),(string *)local_60);
            std::__cxx11::string::~string((string *)local_60);
            ovf_file_ptr_local._4_4_ = -2;
          }
        }
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(segment_local->valueunits + 0x98),
                   "libovf ovf_write_segment_8: segment not correctly initialized");
        ovf_file_ptr_local._4_4_ = -2;
      }
    }
  }
  return ovf_file_ptr_local._4_4_;
}

Assistant:

int ovf_write_segment_8(struct ovf_file *ovf_file_ptr, const struct ovf_segment *segment, double *data, int format)
try
{
    if( !ovf_file_ptr )
        return OVF_ERROR;

    if( !segment )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_write_segment_8: invalid segment pointer";
        return OVF_ERROR;
    }

    if( !check_segment(segment) )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_write_segment_8: segment not correctly initialized";
        return OVF_ERROR;
    }

    if( !data )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_write_segment_8: invalid data pointer";
        return OVF_ERROR;
    }

    if( format == OVF_FORMAT_BIN8 ||
        format == OVF_FORMAT_BIN4 )
        format = OVF_FORMAT_BIN;

    if( format != OVF_FORMAT_BIN  &&
        format != OVF_FORMAT_TEXT &&
        format != OVF_FORMAT_CSV  )
    {
        ovf_file_ptr->_state->message_latest =
            fmt::format("libovf ovf_write_segment_8: invalid format \'{}\'...", format);
        return OVF_ERROR;
    }

    int retcode = ovf::detail::write::segment(ovf_file_ptr, segment, data, false, format);
    if (retcode != OVF_OK)
        ovf_file_ptr->_state->message_latest += "\novf_write_segment_8 failed.";
    return retcode;
}
catch( ... )
{
    return OVF_ERROR;
}